

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.h
# Opt level: O3

QString * __thiscall ResString::getQString(QString *__return_storage_ptr__,ResString *this)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
  if (pEVar1 != (Executable *)0x0) {
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,this->offset,1,(ulong)*this->sizePtr,0);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      QString::fromUtf16((wchar16 *)__return_storage_ptr__,CONCAT44(extraout_var,iVar2));
      return __return_storage_ptr__;
    }
  }
  QVar3.m_data = (storage_type *)0x0;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString getQString()
    {
        if (this->m_Exe == NULL) return ""; //ERROR
        WORD* entries = ptr;
        int size = *(sizePtr);
        WORD *content = (WORD*) this->m_Exe->getContentAt(offset,Executable::RAW, size);
        if (content == NULL) return "";

        return QString::fromUtf16(reinterpret_cast<const char16_t*>(content), size);
    }